

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

int lws_rxflow_cache(lws *wsi,uchar *buf,int n,int len)

{
  int iVar1;
  size_t sVar2;
  int local_44;
  int m;
  int ret;
  size_t blen;
  uint8_t *buffered;
  lws_context_per_thread *pt;
  int len_local;
  int n_local;
  uchar *buf_local;
  lws *wsi_local;
  
  buffered = (uint8_t *)(wsi->context->pt + (int)wsi->tsi);
  local_44 = 0;
  pt._0_4_ = len;
  pt._4_4_ = n;
  _len_local = buf;
  buf_local = (uchar *)wsi;
  sVar2 = lws_buflist_next_segment_len(&wsi->buflist,(uint8_t **)&blen);
  if (sVar2 != 0) {
    if (((blen <= _len_local) && (_len_local + (int)(uint)pt <= (uchar *)(blen + sVar2))) &&
       (sVar2 != (long)(int)(uint)pt)) {
      lws_buflist_use_segment((lws_buflist **)(buf_local + 0x280),sVar2 - (long)(int)(uint)pt);
      _lws_log(0x10,"%s: trim existing rxflow %d -> %d\n","lws_rxflow_cache",sVar2 & 0xffffffff,
               (ulong)(uint)pt);
      return 2;
    }
    local_44 = 1;
  }
  _lws_log(0x10,"%s: rxflow append %d\n","lws_rxflow_cache",(ulong)((uint)pt - pt._4_4_));
  iVar1 = lws_buflist_append_segment
                    ((lws_buflist **)(buf_local + 0x280),_len_local + pt._4_4_,
                     (long)(int)((uint)pt - pt._4_4_));
  if (iVar1 < 0) {
    wsi_local._4_4_ = -1;
  }
  else {
    if (iVar1 != 0) {
      _lws_log(0x10,"%s: added %p to rxflow list\n","lws_rxflow_cache",buf_local);
      iVar1 = lws_dll2_is_detached((lws_dll2 *)(buf_local + 0x168));
      if (iVar1 != 0) {
        lws_dll2_add_head((lws_dll2 *)(buf_local + 0x168),(lws_dll2_owner *)buffered);
      }
    }
    wsi_local._4_4_ = local_44;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_rxflow_cache(struct lws *wsi, unsigned char *buf, int n, int len)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *buffered;
	size_t blen;
	int ret = LWSRXFC_CACHED, m;

	/* his RX is flowcontrolled, don't send remaining now */
	blen = lws_buflist_next_segment_len(&wsi->buflist, &buffered);
	if (blen) {
		if (buf >= buffered && buf + len <= buffered + blen &&
		    blen != (size_t)len) {
			/*
			 * rxflow while we were spilling prev rxflow
			 *
			 * len indicates how much was unused, then... so trim
			 * the head buflist to match that situation
			 */

			lws_buflist_use_segment(&wsi->buflist, blen - len);
			lwsl_debug("%s: trim existing rxflow %d -> %d\n",
					__func__, (int)blen, (int)len);

			return LWSRXFC_TRIMMED;
		}
		ret = LWSRXFC_ADDITIONAL;
	}

	/* a new rxflow, buffer it and warn caller */

	lwsl_debug("%s: rxflow append %d\n", __func__, len - n);
	m = lws_buflist_append_segment(&wsi->buflist, buf + n, len - n);

	if (m < 0)
		return LWSRXFC_ERROR;
	if (m) {
		lwsl_debug("%s: added %p to rxflow list\n", __func__, wsi);
		if (lws_dll2_is_detached(&wsi->dll_buflist))
			lws_dll2_add_head(&wsi->dll_buflist, &pt->dll_buflist_owner);
	}

	return ret;
}